

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

void __thiscall
Web_Context::Note_Changed(Web_Context *this,Am_Object_Advanced *object,Am_Slot_Key key)

{
  Output_Port *this_00;
  Am_Slot slot;
  Am_Slot local_20;
  
  this_00 = Output_Port::Search(this->owner->out_list,object,key);
  if (this_00 == (Output_Port *)0x0) {
    local_20 = Am_Object_Advanced::Get_Slot(object,key);
    Am_Slot::Change(&local_20,&(this->owner->interface).super_Am_Constraint);
    Am_Slot::Add_Constraint(&local_20,&(this->owner->interface).super_Am_Constraint);
  }
  else {
    if ((this_00->context).data != (this->validating_slot).data) {
      Am_Slot::Change(&this_00->context,&(this->owner->interface).super_Am_Constraint);
      return;
    }
    this->changed = true;
    this->been_set = true;
  }
  return;
}

Assistant:

void
Web_Context::Note_Changed(const Am_Object_Advanced &object, Am_Slot_Key key)
{
  Output_Port *curr = owner->out_list->Search(object, key);
  if (curr) {
    if (curr->context == validating_slot) {
      been_set = true;
      changed = true;
    } else
      curr->context.Change(*owner);
    return;
  }
  Am_Slot slot = object.Get_Slot(key);
  slot.Change(*owner);
  slot.Add_Constraint(*owner);
}